

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config_mapping.c
# Opt level: O3

void clear_elements(void)

{
  if (db != (cfg_db *)0x0) {
    cfg_db_remove();
  }
  db = (cfg_db *)cfg_db_add();
  cfg_db_set_entry_ext(db,"sec","secname","string","abc",1,1);
  cfg_db_set_entry_ext(db,"sec","secname","string_array","pm",1,1);
  cfg_db_set_entry_ext(db,"sec","secname","choice","choice2",1,1);
  cfg_db_set_entry_ext(db,"sec","secname","integer","42",1,1);
  cfg_db_set_entry_ext(db,"sec","secname","fractional","-3.1415",1,1);
  cfg_db_set_entry_ext(db,"sec","secname","address","10::1",1,1);
  cfg_db_set_entry_ext(db,"sec","secname","boolean","true",1,1);
  out._len = 0;
  out._error = false;
  memset(out._buf,0,out._total);
  return;
}

Assistant:

static void
clear_elements(void) {
  if (db) {
    cfg_db_remove(db);
  }

  db = cfg_db_add();
  cfg_db_add_entry(db, CFG_SEC, CFG_SECNAME, "string", "abc");
  cfg_db_add_entry(db, CFG_SEC, CFG_SECNAME, "string_array", "pm");
  cfg_db_add_entry(db, CFG_SEC, CFG_SECNAME, "choice", "choice2");
  cfg_db_add_entry(db, CFG_SEC, CFG_SECNAME, "integer", "42");
  cfg_db_add_entry(db, CFG_SEC, CFG_SECNAME, "fractional", "-3.1415");
  cfg_db_add_entry(db, CFG_SEC, CFG_SECNAME, "address", "10::1");
  cfg_db_add_entry(db, CFG_SEC, CFG_SECNAME, "boolean", "true");

  abuf_clear(&out);
}